

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FillableSigningProvider::GetCScript
          (FillableSigningProvider *this,CScriptID *hash,CScript *redeemScriptOut)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&this->cs_KeyStore,
             "cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
             ,0xbc,false);
  cVar1 = std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::find(&(this->mapScripts)._M_t,hash);
  p_Var2 = &(this->mapScripts)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&redeemScriptOut->super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&cVar1._M_node[1]._M_right);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (_Rb_tree_header *)cVar1._M_node != p_Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::GetCScript(const CScriptID &hash, CScript& redeemScriptOut) const
{
    LOCK(cs_KeyStore);
    ScriptMap::const_iterator mi = mapScripts.find(hash);
    if (mi != mapScripts.end())
    {
        redeemScriptOut = (*mi).second;
        return true;
    }
    return false;
}